

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMinMax
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  ushort uVar1;
  uint uVar2;
  ParseNode *pnode_00;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  ArgSlot AVar6;
  BOOL BVar7;
  AsmJsType AVar8;
  Types TVar9;
  undefined4 *puVar10;
  ParseNodeCall *pPVar11;
  HeapAllocator *pHVar12;
  AsmJsType *__s;
  EmitExpressionInfo *pEVar13;
  ParseNodeBin *pPVar14;
  EmitExpressionInfo EVar15;
  RegisterSpace *pRVar16;
  EmitExpressionInfo EVar17;
  AsmJsCompilationException *pAVar18;
  EmitExpressionInfo *pEVar19;
  ParseNodePtr pPVar20;
  AsmJsFunc *pAVar21;
  uint uVar22;
  ulong uVar23;
  uint *puVar24;
  ParseNodePtr pnode_01;
  long lVar25;
  undefined1 local_d0 [8];
  TrackAllocData data;
  AutoArrayPtr<Js::AsmJsType> local_78;
  uint local_5c;
  ParseNodePtr local_58;
  OpCodeAsmJs local_4e;
  AsmJsType local_4c;
  undefined1 auStack_48 [2];
  OpCodeAsmJs op;
  ulong uStack_40;
  
  if ((mathFunction->super_AsmJsFunctionDeclaration).mArgCount != 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x519,"(mathFunction->GetArgCount() == 2)",
                                "mathFunction->GetArgCount() == 2");
    if (!bVar4) goto LAB_0093b55a;
    *puVar10 = 0;
  }
  pPVar11 = ParseNode::AsParseNodeCall(pnode);
  uVar1 = pPVar11->argCount;
  pPVar11 = ParseNode::AsParseNodeCall(pnode);
  local_5c = (uint)uVar1;
  if (local_5c < 2) {
    pAVar18 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar18,L"Math builtin function doesn\'t support arguments");
    __cxa_throw(pAVar18,&AsmJsCompilationException::typeinfo,0);
  }
  local_58 = pPVar11->pnodeArgs;
  local_78.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
  local_78.m_elementCount = 0;
  _auStack_48 = (EmitExpressionInfo *)0x0;
  uStack_40 = 0;
  data.plusSize = (size_t)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  local_d0 = (undefined1  [8])&AsmJsType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_451a025;
  data.filename._0_4_ = 0x524;
  pHVar12 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_d0);
  uVar1 = (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_0093b55a;
    *puVar10 = 0;
  }
  uVar23 = (ulong)((uint)uVar1 * 4);
  __s = (AsmJsType *)Memory::HeapAllocator::AllocT<false>(pHVar12,uVar23);
  if (__s == (AsmJsType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_0093b55a;
    *puVar10 = 0;
  }
  if (uVar1 != 0) {
    memset(__s,0xff,uVar23);
  }
  uVar1 = (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  uVar5 = uVar1;
  if (local_78.super_BasePtr<Js::AsmJsType>.ptr != (AsmJsType *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,Js::AsmJsType>
              (&Memory::HeapAllocator::Instance,local_78.m_elementCount,
               local_78.super_BasePtr<Js::AsmJsType>.ptr);
    uVar5 = (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  }
  local_78.m_elementCount = (size_t)uVar1;
  data.plusSize = (size_t)uVar5;
  local_d0 = (undefined1  [8])&EmitExpressionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_451a025;
  data.filename._0_4_ = 0x525;
  local_78.super_BasePtr<Js::AsmJsType>.ptr = __s;
  pHVar12 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_d0);
  uVar1 = (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_0093b55a;
    *puVar10 = 0;
  }
  pEVar13 = (EmitExpressionInfo *)
            Memory::HeapAllocator::AllocT<false>(pHVar12,(ulong)((uint)uVar1 * 8));
  if (pEVar13 == (EmitExpressionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_0093b55a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  if ((ulong)uVar1 != 0) {
    pEVar19 = pEVar13;
    do {
      pEVar19->super_EmitInfoBase = 0xffffffff;
      pEVar19->type = Void;
      pEVar19 = pEVar19 + 1;
    } while (pEVar19 != pEVar13 + uVar1);
  }
  uVar1 = (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  if (_auStack_48 != (EmitExpressionInfo *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,Js::EmitExpressionInfo>
              (&Memory::HeapAllocator::Instance,uStack_40,_auStack_48);
  }
  pPVar20 = local_58;
  _auStack_48 = pEVar13;
  uStack_40 = (ulong)uVar1;
  pPVar14 = ParseNode::AsParseNodeBin(local_58);
  pnode_00 = pPVar14->pnode1;
  pPVar14 = ParseNode::AsParseNodeBin(pPVar20);
  pPVar20 = pPVar14->pnode2;
  EVar15 = Emit(this,pnode_00);
  *_auStack_48 = EVar15;
  (local_78.super_BasePtr<Js::AsmJsType>.ptr)->which_ = (_auStack_48->type).which_;
  local_58 = (ParseNodePtr)__tls_get_addr(&PTR_01548f08);
  uVar22 = 1;
  do {
    pnode_01 = pPVar20;
    if (pPVar20->nop == knopList) {
      pPVar14 = ParseNode::AsParseNodeBin(pPVar20);
      pnode_01 = pPVar14->pnode1;
      pPVar14 = ParseNode::AsParseNodeBin(pPVar20);
      pPVar20 = pPVar14->pnode2;
    }
    EVar15 = Emit(this,pnode_01);
    _auStack_48[1] = EVar15;
    local_78.super_BasePtr<Js::AsmJsType>.ptr[1].which_ = _auStack_48[1].type.which_;
    AsmJsRetType::AsmJsRetType((AsmJsRetType *)local_d0);
    bVar4 = AsmJsMathFunction::SupportsMathCall
                      (mathFunction,(mathFunction->super_AsmJsFunctionDeclaration).mArgCount,
                       local_78.super_BasePtr<Js::AsmJsType>.ptr,&local_4e,(AsmJsRetType *)local_d0)
    ;
    if (!bVar4) {
      pAVar18 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar18,L"Math builtin function doesn\'t support arguments");
      __cxa_throw(pAVar18,&AsmJsCompilationException::typeinfo,0);
    }
    data._32_8_ = pPVar20;
    AVar6 = AsmJsFunctionDeclaration::GetArgByteSize
                      (&mathFunction->super_AsmJsFunctionDeclaration,(ArgSlot)local_5c);
    AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(AVar6 + 8 >> 3) + 2);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,_auStack_48 + 1);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,_auStack_48);
    AVar8 = AsmJsRetType::toType((AsmJsRetType *)local_d0);
    local_4c = AsmJsRetType::toType((AsmJsRetType *)local_d0);
    bVar4 = AsmJsType::isSigned(&local_4c);
    if (bVar4) {
      pAVar21 = this->mFunction;
      TVar9 = WAsmJs::FromPrimitiveType<int>();
    }
    else {
      local_4c = AsmJsRetType::toType((AsmJsRetType *)local_d0);
      bVar4 = AsmJsType::isDouble(&local_4c);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_58->nop = knopName;
        local_58->field_0x1 = 0;
        local_58->grfpn = 0;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x557,"(retType.toType().isDouble())",
                                    "retType.toType().isDouble()");
        if (!bVar4) goto LAB_0093b55a;
        local_58->nop = knopNone;
        local_58->field_0x1 = 0;
        local_58->grfpn = 0;
      }
      pAVar21 = this->mFunction;
      TVar9 = WAsmJs::FromPrimitiveType<double>();
    }
    pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar21->mTypedRegisterAllocator,TVar9);
    EVar17.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar16);
    AsmJsByteCodeWriter::AsmReg3
              (&this->mWriter,local_4e,EVar17.super_EmitInfoBase.location,
               (_auStack_48->super_EmitInfoBase).location,_auStack_48[1].super_EmitInfoBase.location
              );
    EVar15.type.which_ = AVar8.which_;
    EVar15.super_EmitInfoBase.location = EVar17.super_EmitInfoBase.location;
    *_auStack_48 = EVar15;
    if ((mathFunction->super_AsmJsFunctionDeclaration).mArgCount != 0) {
      lVar25 = 0;
      uVar23 = 0;
      do {
        bVar4 = AsmJsType::isSubType
                          ((AsmJsType *)((long)&(_auStack_48->type).which_ + lVar25),(AsmJsType)0x4)
        ;
        if (bVar4) {
          pAVar21 = this->mFunction;
          puVar24 = (uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar25);
          TVar9 = WAsmJs::FromPrimitiveType<double>();
          pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                              (&pAVar21->mTypedRegisterAllocator,TVar9);
          if (((puVar24 == (uint *)0x0) || (uVar2 = *puVar24, uVar2 == 0xffffffff)) ||
             (pRVar16->mRegisterCount <= uVar2)) {
            pAVar18 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar18,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar25))
            ;
LAB_0093b549:
            __cxa_throw(pAVar18,&AsmJsCompilationException::typeinfo,0);
          }
        }
        else {
          bVar4 = AsmJsType::isSubType
                            ((AsmJsType *)((long)&(_auStack_48->type).which_ + lVar25),
                             (AsmJsType)0xc);
          if (bVar4) {
            pAVar21 = this->mFunction;
            puVar24 = (uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar25);
            TVar9 = WAsmJs::FromPrimitiveType<int>();
            pRVar16 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                                (&pAVar21->mTypedRegisterAllocator,TVar9);
            if (((puVar24 == (uint *)0x0) || (uVar2 = *puVar24, uVar2 == 0xffffffff)) ||
               (pRVar16->mRegisterCount <= uVar2)) {
              pAVar18 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
              AsmJsCompilationException::AsmJsCompilationException
                        (pAVar18,L"Invalid Node location[%d] ",
                         (ulong)*(uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar25
                                         ));
              goto LAB_0093b549;
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            local_58->nop = knopName;
            local_58->field_0x1 = 0;
            local_58->grfpn = 0;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x56b,"((0))","UNREACHED");
            if (!bVar4) goto LAB_0093b55a;
            local_58->nop = knopNone;
            local_58->field_0x1 = 0;
            local_58->grfpn = 0;
          }
        }
        uVar23 = uVar23 + 1;
        lVar25 = lVar25 + 8;
      } while (uVar23 < (mathFunction->super_AsmJsFunctionDeclaration).mArgCount);
    }
    uVar22 = uVar22 + 1;
    pPVar20 = (ParseNodePtr)data._32_8_;
    if (uVar22 == local_5c) {
      AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr
                ((AutoArrayPtr<Js::EmitExpressionInfo> *)auStack_48);
      AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr(&local_78);
      EVar17.type.which_ = AVar8.which_;
      return EVar17;
    }
  } while( true );
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMinMax(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        Assert(mathFunction->GetArgCount() == 2);
        uint16 argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;

        if (argCount < 2)
        {
            throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        types.Set(HeapNewArray(AsmJsType, mathFunction->GetArgCount()), mathFunction->GetArgCount());
        argsInfo.Set(HeapNewArray(EmitExpressionInfo, mathFunction->GetArgCount()), mathFunction->GetArgCount());

        ParseNode * arg = ParserWrapper::GetBinaryLeft(argNode);
        argNode = ParserWrapper::GetBinaryRight(argNode);
        // Emit first arg as arg0
        argsInfo[0] = Emit(arg);
        types[0] = argsInfo[0].type;

        EmitExpressionInfo dstInfo;
        for (int i = 1; i < argCount; i++)
        {
            if (argNode->nop == knopList)
            {
                arg = ParserWrapper::GetBinaryLeft(argNode);
                argNode = ParserWrapper::GetBinaryRight(argNode);
            }
            else
            {
                arg = argNode;
            }
            // arg1 will always be the next arg in the argList
            argsInfo[1] = Emit(arg);
            types[1] = argsInfo[1].type;

            // Check if this function supports the type of these arguments
            AsmJsRetType retType;
            OpCodeAsmJs op;
            const bool supported = mathFunction->SupportsMathCall(mathFunction->GetArgCount(), types, op, retType);
            if (!supported)
            {
                throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
            }

            const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
            // +1 is for function object
            int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;
            // +1 is for return address

            // Make sure we have enough memory allocated for OutParameters
            mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);
            mFunction->ReleaseLocationGeneric(&argsInfo[1]);
            mFunction->ReleaseLocationGeneric(&argsInfo[0]);

            dstInfo.type = retType.toType();
            if (retType.toType().isSigned())
            {
                dstInfo.location = mFunction->AcquireTmpRegister<int>();
            }
            else
            {
                Assert(retType.toType().isDouble());
                dstInfo.location = mFunction->AcquireTmpRegister<double>();
            }

            mWriter.AsmReg3(op, dstInfo.location, argsInfo[0].location, argsInfo[1].location);
            // for max/min calls with more than 2 arguments, we use the result of previous call for arg0
            argsInfo[0] = dstInfo;
#if DBG
            for (uint j = 0; j < mathFunction->GetArgCount(); j++)
            {
                if (argsInfo[j].type.isSubType(AsmJsType::MaybeDouble))
                {
                    CheckNodeLocation(argsInfo[j], double);
                }
                else if (argsInfo[j].type.isSubType(AsmJsType::Intish))
                {
                    CheckNodeLocation(argsInfo[j], int);
                }
                else
                {
                    Assert(UNREACHED);
                }
            }
#endif
        }
        return dstInfo;
    }